

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::View<float,false,std::allocator<unsigned_long>>::coordinatesToOffset<unsigned_long*>
          (View<float,false,std::allocator<unsigned_long>> *this,unsigned_long *it,size_t *out)

{
  ulong uVar1;
  unsigned_long uVar2;
  size_t sVar3;
  size_t j;
  ulong dimension;
  
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
  *out = 0;
  dimension = 0;
  while( true ) {
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<float,_false,_std::allocator<unsigned_long>_> *)this);
    if (sVar3 <= dimension) break;
    uVar1 = it[dimension];
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<float,_false,_std::allocator<unsigned_long>_> *)this,dimension);
    marray_detail::Assert<bool>(uVar1 < sVar3);
    uVar2 = it[dimension];
    sVar3 = View<float,_false,_std::allocator<unsigned_long>_>::strides
                      ((View<float,_false,_std::allocator<unsigned_long>_> *)this,dimension);
    *out = *out + sVar3 * uVar2;
    dimension = dimension + 1;
  }
  return;
}

Assistant:

inline void
View<T, isConst, A>::coordinatesToOffset
(
    CoordinateIterator it,
    std::size_t& out
) const
{
    testInvariant();
    out = 0;
    for(std::size_t j=0; j<this->dimension(); ++j, ++it) {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || static_cast<std::size_t>(*it) < shape(j));
        out += static_cast<std::size_t>(*it) * strides(j);
    }
}